

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

string * efsw::FileSystem::getRealPath(string *__return_storage_ptr__,string *path)

{
  char dir [4096];
  allocator local_1039;
  string local_1038 [32];
  char local_1018 [4104];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  realpath((path->_M_dataplus)._M_p,local_1018);
  std::__cxx11::string::string(local_1038,local_1018,&local_1039);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1038);
  std::__cxx11::string::~string(local_1038);
  return __return_storage_ptr__;
}

Assistant:

std::string FileSystem::getRealPath( const std::string& path ) {
	std::string realPath;
#if defined( EFSW_PLATFORM_POSIX )
	char dir[PATH_MAX];
	realpath( path.c_str(), &dir[0] );
	realPath = std::string( dir );
#elif EFSW_OS == EFSW_OS_WIN
	wchar_t dir[_MAX_PATH + 1];
	GetFullPathNameW( String::fromUtf8( path ).toWideString().c_str(), _MAX_PATH, &dir[0],
					  nullptr );
	realPath = String( dir ).toUtf8();
#else
#warning FileSystem::getRealPath() not implemented on this platform.
#endif
	return realPath;
}